

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O3

void __thiscall Simplex::printU(Simplex *this)

{
  vec<IndexVal> *pvVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  fwrite("U:\n",3,1,_stderr);
  if (0 < this->m) {
    uVar2 = 0;
    do {
      if ((this->U_rows).data[uVar2].sz != 0) {
        fprintf(_stderr,"row %d: ",uVar2 & 0xffffffff);
        pvVar1 = (this->U_rows).data;
        if (pvVar1[uVar2].sz != 0) {
          lVar3 = 0;
          uVar4 = 0;
          do {
            fprintf(_stderr,"%d:%.3Lf ",
                    (ulong)*(uint *)((long)&(pvVar1[uVar2].data)->field_0 + lVar3 + 0xc));
            uVar4 = uVar4 + 1;
            pvVar1 = (this->U_rows).data;
            lVar3 = lVar3 + 0x10;
          } while (uVar4 < pvVar1[uVar2].sz);
          if (pvVar1[uVar2].sz != 0) {
            fputc(10,_stderr);
          }
        }
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)this->m);
    if (0 < this->m) {
      uVar2 = 0;
      do {
        if ((this->U_cols).data[uVar2].sz != 0) {
          fprintf(_stderr,"col %d: ",uVar2 & 0xffffffff);
          pvVar1 = (this->U_cols).data;
          if (pvVar1[uVar2].sz != 0) {
            lVar3 = 0;
            uVar4 = 0;
            do {
              fprintf(_stderr,"%d:%.3Lf ",
                      (ulong)*(uint *)((long)&(pvVar1[uVar2].data)->field_0 + lVar3 + 0xc));
              uVar4 = uVar4 + 1;
              pvVar1 = (this->U_cols).data;
              lVar3 = lVar3 + 0x10;
            } while (uVar4 < pvVar1[uVar2].sz);
            if (pvVar1[uVar2].sz != 0) {
              fputc(10,_stderr);
            }
          }
        }
        uVar2 = uVar2 + 1;
      } while ((long)uVar2 < (long)this->m);
    }
  }
  fwrite("diag: ",6,1,_stderr);
  if (0 < this->m) {
    uVar2 = 0;
    do {
      fprintf(_stderr,"%d:%.3Lf ",uVar2 & 0xffffffff);
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)this->m);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void Simplex::printU() {
	fprintf(stderr, "U:\n");
	for (int i = 0; i < m; i++) {
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "row %d: ", i);
		}
		for (unsigned int j = 0; j < U_rows[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_rows[i][j].index(), U_rows[i][j].val());
		}
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	for (int i = 0; i < m; i++) {
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "col %d: ", i);
		}
		for (unsigned int j = 0; j < U_cols[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_cols[i][j].index(), U_cols[i][j].val());
		}
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	fprintf(stderr, "diag: ");
	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d:%.3Lf ", i, U_diag[i]);
	}
	fprintf(stderr, "\n");
}